

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mousenu.c
# Opt level: O3

int al_get_mouse_state_axis(ALLEGRO_MOUSE_STATE *state,int axis)

{
  switch(axis) {
  case 0:
    break;
  case 1:
    state = (ALLEGRO_MOUSE_STATE *)&state->y;
    break;
  case 2:
    state = (ALLEGRO_MOUSE_STATE *)&state->z;
    break;
  case 3:
    state = (ALLEGRO_MOUSE_STATE *)&state->w;
    break;
  default:
    state = (ALLEGRO_MOUSE_STATE *)(state->more_axes + (long)axis + -4);
  }
  return state->x;
}

Assistant:

int al_get_mouse_state_axis(const ALLEGRO_MOUSE_STATE *state, int axis)
{
   ASSERT(state);
   ASSERT(axis >= 0);
   ASSERT(axis < (4 + ALLEGRO_MOUSE_MAX_EXTRA_AXES));

   switch (axis) {
      case 0:
         return state->x;
      case 1:
         return state->y;
      case 2:
         return state->z;
      case 3:
         return state->w;
      default:
         return state->more_axes[axis - 4];
   }
}